

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.h
# Opt level: O2

void __thiscall
TextFile::writeFormat<std::__cxx11::string>
          (TextFile *this,char *text,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  void *__buf;
  string message;
  string local_30;
  
  tinyformat::format<std::__cxx11::string>(&local_30,(tinyformat *)text,(char *)args,in_RCX);
  write(this,(int)&local_30,__buf,(size_t)in_RCX);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void writeFormat(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		write(message);
	}